

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
fixedPreciseMeasurement_methods_Test::~fixedPreciseMeasurement_methods_Test
          (fixedPreciseMeasurement_methods_Test *this)

{
  fixedPreciseMeasurement_methods_Test *this_local;
  
  ~fixedPreciseMeasurement_methods_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, methods)
{
    fixed_precise_measurement size(1.2, precise::m);
    auto f2 = size.convert_to(precise::in);
    EXPECT_TRUE(f2 == size);

    precise_measurement m3(1.0, f2.as_unit());
    EXPECT_DOUBLE_EQ(m3.value(), 1.0);
    EXPECT_TRUE(m3 == f2);

    EXPECT_DOUBLE_EQ(f2.value_as(precise::m), 1.2);
    EXPECT_DOUBLE_EQ(size.value_as(f2.as_unit()), 1.0);

    size += 0.1;
    EXPECT_TRUE(size > f2);
    EXPECT_TRUE(size > m3);
    EXPECT_TRUE(f2 < size);
    EXPECT_TRUE(m3 < size);
    EXPECT_TRUE(size > 1.2);
    EXPECT_TRUE(1.2 < size);

    EXPECT_TRUE(size >= f2);
    EXPECT_TRUE(size >= m3);
    EXPECT_TRUE(f2 <= size);
    EXPECT_TRUE(m3 <= size);
    EXPECT_TRUE(size >= 1.2);
    EXPECT_TRUE(1.2 <= size);

    size -= 0.1;
    EXPECT_TRUE(size == f2);
    EXPECT_TRUE(size == m3);
    EXPECT_TRUE(f2 == size);
    EXPECT_TRUE(m3 == size);
    EXPECT_TRUE(size == 1.2);
    EXPECT_TRUE(1.2 == size);

    EXPECT_FALSE(size != 1.2);
    EXPECT_FALSE(1.2 != size);

    EXPECT_TRUE(size >= f2);
    EXPECT_TRUE(size >= m3);
    EXPECT_TRUE(f2 >= size);
    EXPECT_TRUE(m3 >= size);
    EXPECT_TRUE(size >= 1.2);
    EXPECT_TRUE(1.2 >= size);

    EXPECT_TRUE(size <= f2);
    EXPECT_TRUE(size <= m3);
    EXPECT_TRUE(f2 <= size);
    EXPECT_TRUE(m3 <= size);
    EXPECT_TRUE(size <= 1.2);
    EXPECT_TRUE(1.2 <= size);

    EXPECT_TRUE(is_valid(size));
}